

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignumber.cpp
# Opt level: O3

BigNumber * __thiscall
BigNumber::multiply(BigNumber *__return_storage_ptr__,BigNumber *this,BigNumber *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  BigNumber *pBVar7;
  ulong uVar8;
  uint __len;
  uint uVar9;
  uint uVar10;
  _Alloc_hider _Var11;
  long lVar12;
  long lVar14;
  long lVar15;
  BigNumber *b;
  string rr;
  string __str_2;
  BigNumber b1;
  BigNumber b2;
  BigNumber local_208;
  BigNumber local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  BigNumber local_1c0;
  BigNumber local_1a0;
  ulong local_180;
  long *local_178;
  long local_170;
  long local_168 [2];
  long local_158;
  BigNumber local_150;
  BigNumber local_130;
  BigNumber local_110;
  BigNumber local_f0;
  BigNumber local_d0;
  BigNumber local_b0;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  size_type sVar13;
  
  pcVar3 = (other->_numberString)._M_dataplus._M_p;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar3,pcVar3 + (other->_numberString)._M_string_length);
  bVar5 = operator>((BigNumber *)local_90,this);
  pBVar7 = this;
  if (bVar5) {
    pBVar7 = other;
  }
  local_1c0._numberString._M_dataplus._M_p = (pointer)&local_1c0._numberString.field_2;
  pcVar3 = (pBVar7->_numberString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar3,pcVar3 + (pBVar7->_numberString)._M_string_length);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  paVar1 = &local_d0._numberString.field_2;
  pcVar3 = (other->_numberString)._M_dataplus._M_p;
  local_d0._numberString._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,pcVar3 + (other->_numberString)._M_string_length);
  bVar5 = operator>(&local_d0,this);
  if (bVar5) {
    other = this;
  }
  local_1a0._numberString._M_dataplus._M_p = (pointer)&local_1a0._numberString.field_2;
  pcVar3 = (other->_numberString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar3,pcVar3 + (other->_numberString)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._numberString._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._numberString._M_dataplus._M_p,
                    local_d0._numberString.field_2._M_allocated_capacity + 1);
  }
  if (*local_1c0._numberString._M_dataplus._M_p == '-') {
    if (*local_1a0._numberString._M_dataplus._M_p == '-') {
      negate(&local_208,&local_1c0);
      negate(&local_b0,&local_1a0);
      multiply(__return_storage_ptr__,&local_208,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._numberString._M_dataplus._M_p != &local_b0._numberString.field_2) {
        operator_delete(local_b0._numberString._M_dataplus._M_p,
                        local_b0._numberString.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._numberString._M_dataplus._M_p == &local_208._numberString.field_2)
      goto LAB_0010439b;
LAB_00104244:
      local_40._M_allocated_capacity =
           CONCAT71(local_208._numberString.field_2._M_allocated_capacity._1_7_,
                    local_208._numberString.field_2._M_local_buf[0]);
      _Var11._M_p = local_208._numberString._M_dataplus._M_p;
    }
    else {
      negate(&local_1e8,&local_1c0);
      paVar1 = &local_f0._numberString.field_2;
      local_f0._numberString._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_1a0._numberString._M_dataplus._M_p,
                 local_1a0._numberString._M_dataplus._M_p + local_1a0._numberString._M_string_length
                );
      multiply(&local_208,&local_1e8,&local_f0);
      negate(__return_storage_ptr__,&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._numberString._M_dataplus._M_p != &local_208._numberString.field_2) {
        operator_delete(local_208._numberString._M_dataplus._M_p,
                        CONCAT71(local_208._numberString.field_2._M_allocated_capacity._1_7_,
                                 local_208._numberString.field_2._M_local_buf[0]) + 1);
      }
      local_110._numberString.field_2._M_allocated_capacity =
           local_f0._numberString.field_2._M_allocated_capacity;
      _Var11._M_p = local_f0._numberString._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._numberString._M_dataplus._M_p != paVar1) {
LAB_00104378:
        operator_delete(_Var11._M_p,local_110._numberString.field_2._M_allocated_capacity + 1);
      }
LAB_00104380:
      local_40._M_allocated_capacity = local_1e8._numberString.field_2._M_allocated_capacity;
      _Var11._M_p = local_1e8._numberString._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._numberString._M_dataplus._M_p == &local_1e8._numberString.field_2)
      goto LAB_0010439b;
    }
  }
  else {
    if (*local_1a0._numberString._M_dataplus._M_p == '-') {
      negate(&local_1e8,&local_1a0);
      paVar1 = &local_110._numberString.field_2;
      local_110._numberString._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_1c0._numberString._M_dataplus._M_p,
                 local_1c0._numberString._M_dataplus._M_p +
                 CONCAT44(local_1c0._numberString._M_string_length._4_4_,
                          (int)local_1c0._numberString._M_string_length));
      multiply(&local_208,&local_1e8,&local_110);
      negate(__return_storage_ptr__,&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._numberString._M_dataplus._M_p != &local_208._numberString.field_2) {
        operator_delete(local_208._numberString._M_dataplus._M_p,
                        CONCAT71(local_208._numberString.field_2._M_allocated_capacity._1_7_,
                                 local_208._numberString.field_2._M_local_buf[0]) + 1);
      }
      _Var11._M_p = local_110._numberString._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._numberString._M_dataplus._M_p != paVar1) goto LAB_00104378;
      goto LAB_00104380;
    }
    paVar1 = &local_130._numberString.field_2;
    local_130._numberString._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_1c0._numberString._M_dataplus._M_p,
               local_1c0._numberString._M_dataplus._M_p +
               CONCAT44(local_1c0._numberString._M_string_length._4_4_,
                        (int)local_1c0._numberString._M_string_length));
    local_208._numberString._M_dataplus._M_p = (pointer)0x0;
    bVar5 = equals(&local_130,(longlong *)&local_208);
    if (bVar5) {
      bVar5 = true;
    }
    else {
      paVar2 = &local_150._numberString.field_2;
      local_150._numberString._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,local_1a0._numberString._M_dataplus._M_p,
                 local_1a0._numberString._M_dataplus._M_p + local_1a0._numberString._M_string_length
                );
      local_1e8._numberString._M_dataplus._M_p = (pointer)0x0;
      bVar5 = equals(&local_150,(longlong *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._numberString._M_dataplus._M_p != paVar2) {
        operator_delete(local_150._numberString._M_dataplus._M_p,
                        local_150._numberString.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._numberString._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._numberString._M_dataplus._M_p,
                      local_130._numberString.field_2._M_allocated_capacity + 1);
    }
    local_1c8 = &(__return_storage_ptr__->_numberString).field_2;
    (__return_storage_ptr__->_numberString)._M_dataplus._M_p = (pointer)local_1c8;
    if (bVar5 != false) {
      std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
      *(__return_storage_ptr__->_numberString)._M_dataplus._M_p = '0';
      goto LAB_0010439b;
    }
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
    *(__return_storage_ptr__->_numberString)._M_dataplus._M_p = '0';
    sVar13 = CONCAT44(local_1c0._numberString._M_string_length._4_4_,
                      (int)local_1c0._numberString._M_string_length);
    if (CONCAT44(local_1c0._numberString._M_string_length._4_4_,
                 (int)local_1c0._numberString._M_string_length) !=
        local_1a0._numberString._M_string_length) {
      uVar8 = 1;
      do {
        std::__cxx11::string::_M_replace_aux((ulong)&local_1a0,0,0,'\x01');
        bVar5 = uVar8 < CONCAT44(local_1c0._numberString._M_string_length._4_4_,
                                 (int)local_1c0._numberString._M_string_length) -
                        local_1a0._numberString._M_string_length;
        uVar8 = (ulong)((int)uVar8 + 1);
        sVar13 = local_1a0._numberString._M_string_length;
      } while (bVar5);
    }
    lVar12 = sVar13 - 1;
    if (-1 < lVar12) {
      paVar1 = &local_1e8._numberString.field_2;
      local_180 = 0;
      uVar9 = 0;
      do {
        local_208._numberString._M_dataplus._M_p = (pointer)&local_208._numberString.field_2;
        local_208._numberString._M_string_length = 0;
        local_208._numberString.field_2._M_local_buf[0] = '\0';
        lVar14 = lVar12;
        lVar15 = (long)((int)local_1c0._numberString._M_string_length + -1);
        local_158 = lVar12;
        if (-1 < (long)((int)local_1c0._numberString._M_string_length + -1)) {
          do {
            uVar10 = (local_1c0._numberString._M_dataplus._M_p[lVar15] + -0x30) *
                     (local_1a0._numberString._M_dataplus._M_p[lVar12] + -0x30) + uVar9;
            if ((lVar15 == 0) || ((int)uVar10 < 10)) {
              uVar9 = -uVar10;
              if (0 < (int)uVar10) {
                uVar9 = uVar10;
              }
              __len = 1;
              if (9 < uVar9) {
                uVar8 = (ulong)uVar9;
                uVar4 = 4;
                do {
                  __len = uVar4;
                  uVar6 = (uint)uVar8;
                  if (uVar6 < 100) {
                    __len = __len - 2;
                    goto LAB_00104691;
                  }
                  if (uVar6 < 1000) {
                    __len = __len - 1;
                    goto LAB_00104691;
                  }
                  if (uVar6 < 10000) goto LAB_00104691;
                  uVar8 = uVar8 / 10000;
                  uVar4 = __len + 4;
                } while (99999 < uVar6);
                __len = __len + 1;
              }
LAB_00104691:
              local_1e8._numberString._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_1e8,(char)__len - (char)((int)uVar10 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_1e8._numberString._M_dataplus._M_p + (uVar10 >> 0x1f),__len,uVar9);
              std::__cxx11::string::replace
                        ((ulong)&local_208,0,(char *)0x0,
                         (ulong)local_1e8._numberString._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._numberString._M_dataplus._M_p != paVar1) {
                operator_delete(local_1e8._numberString._M_dataplus._M_p,
                                local_1e8._numberString.field_2._M_allocated_capacity + 1);
              }
              uVar9 = 0;
              lVar12 = local_158;
            }
            else {
              local_1e8._numberString._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x01');
              uVar9 = uVar10 / 10;
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_1e8._numberString._M_dataplus._M_p,1,uVar10 % 10);
              std::__cxx11::string::replace
                        ((ulong)&local_208,0,(char *)0x0,
                         (ulong)local_1e8._numberString._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._numberString._M_dataplus._M_p != paVar1) {
                operator_delete(local_1e8._numberString._M_dataplus._M_p,
                                local_1e8._numberString.field_2._M_allocated_capacity + 1);
              }
            }
            bVar5 = 0 < lVar15;
            lVar14 = lVar12;
            lVar15 = lVar15 + -1;
          } while (bVar5);
        }
        uVar10 = (uint)local_180;
        uVar8 = local_180 & 0xffffffff;
        while (uVar10 != 0) {
          std::__cxx11::string::append((char *)&local_208);
          uVar10 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar10;
        }
        local_178 = local_168;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_208._numberString._M_dataplus._M_p,
                   local_208._numberString._M_dataplus._M_p +
                   local_208._numberString._M_string_length);
        local_1e8._numberString._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,local_178,local_170 + (long)local_178);
        operator+=(__return_storage_ptr__,&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._numberString._M_dataplus._M_p != paVar1) {
          operator_delete(local_1e8._numberString._M_dataplus._M_p,
                          local_1e8._numberString.field_2._M_allocated_capacity + 1);
        }
        if (local_178 != local_168) {
          operator_delete(local_178,local_168[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._numberString._M_dataplus._M_p != &local_208._numberString.field_2) {
          operator_delete(local_208._numberString._M_dataplus._M_p,
                          CONCAT71(local_208._numberString.field_2._M_allocated_capacity._1_7_,
                                   local_208._numberString.field_2._M_local_buf[0]) + 1);
        }
        local_180 = (ulong)((int)local_180 + 1);
        lVar12 = lVar14 + -1;
      } while (0 < lVar14);
    }
    lVar12 = std::__cxx11::string::find_first_not_of((char)__return_storage_ptr__,0x30);
    if (lVar12 == -1) {
      paVar1 = &local_208._numberString.field_2;
      local_208._numberString._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"0","");
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      pcVar3 = (__return_storage_ptr__->_numberString)._M_dataplus._M_p;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar3,
                 pcVar3 + (__return_storage_ptr__->_numberString)._M_string_length);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._numberString._M_dataplus._M_p == paVar1) goto LAB_0010439b;
      goto LAB_00104244;
    }
    std::__cxx11::string::find_first_not_of((char)__return_storage_ptr__,0x30);
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    pcVar3 = (__return_storage_ptr__->_numberString)._M_dataplus._M_p;
    local_50[0] = &local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar3,
               pcVar3 + (__return_storage_ptr__->_numberString)._M_string_length);
    _Var11._M_p = (pointer)local_50[0];
    if (local_50[0] == &local_40) goto LAB_0010439b;
  }
  operator_delete(_Var11._M_p,local_40._M_allocated_capacity + 1);
LAB_0010439b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._numberString._M_dataplus._M_p != &local_1a0._numberString.field_2) {
    operator_delete(local_1a0._numberString._M_dataplus._M_p,
                    local_1a0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._numberString._M_dataplus._M_p != &local_1c0._numberString.field_2) {
    operator_delete(local_1c0._numberString._M_dataplus._M_p,
                    local_1c0._numberString.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber BigNumber::multiply(BigNumber other) {
    BigNumber b1 = other > *this ? other : *this;
    BigNumber b2 = other > *this ? *this : other;
    if (b1.isNegative() || b2.isNegative()) {
        if (b1.isNegative() && b2.isNegative()) {
            return b1.negate().multiply(b2.negate());
        }
        else if (b1.isNegative() && !b2.isNegative()) {
            return b1.negate().multiply(b2).negate();
        }
        else {
            return b2.negate().multiply(b1).negate();
        }
    }
    if (b1 == 0 || b2 == 0) return 0;
    int carry = 0;
    int zeroCounter = 0;
    BigNumber b = 0;
    
    for (unsigned int i = 0; i < b1._numberString.size() - b2._numberString.size(); ++i) {
        b2._numberString.insert(b2._numberString.begin(), '0');
    }
    for (long long int i = (b2._numberString.size() - 1); i >= 0; --i) {
        std::string rr;
        for (long long int j = int(b1._numberString.size() - 1); j >= 0; --j) {
            int val = ((b2._numberString[i] - '0') * (b1._numberString[j] - '0')) + carry;
            carry = 0;
            if (val > 9 && j != 0) {
                carry = val / 10;
                rr.insert(0, std::to_string(val % 10));
            }
            else {
                rr.insert(0, std::to_string(val));
            }
        }
        if (zeroCounter > 0) {
            for (int x = 0; x < zeroCounter; ++x) {
                rr.append("0");
            }
        }
        ++zeroCounter;
        b += BigNumber(rr);
    }
    if (b._numberString.find_first_not_of('0') != std::string::npos) {
        b.setString(b._numberString.erase(0, b._numberString.find_first_not_of('0')));
    }
    else {
        //In the case of all 0's, we only want to return one of them
        b.setString("0");
    }
    return b;
}